

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seqdiff.c
# Opt level: O2

void show_usage(int status)

{
  fwrite("seqdiff - a bioinformatics tool for comparing sequences in two files\n",0x45,1,_stderr);
  fwrite("\n(Written by bct - 2013)     ",0x1d,1,_stderr);
  fprintf(_stderr,"\nUsage:\n%s -1 <first input fasta/fastq file> -2 <second fasta/fastq file>\n\n",
          progname);
  fwrite("  Options:\n    -1, --first,      First sequence file (required)\n    -2, --second,     Second sequence file (required)\n"
         ,0x76,1,_stderr);
  fwrite("    -a, --a_output,   File name for uniques from first file\n    -b, --b_output,   File name for uniques from second file\n    -c, --c_output,   File name for common entries\n"
         ,0xac,1,_stderr);
  fwrite("    -d, --headers,    Compare headers instead of sequences (default: false)\n    -s, --summary, Just show summary stats? (default: false)\n"
         ,0x89,1,_stderr);
  fwrite("    -h, --help,       Display this help and exit\n    -v, --verbose,    Print extra details during the run\n    --version,        Output version information and exit\n\n"
         ,0xa5,1,_stderr);
  exit(status);
}

Assistant:

void show_usage(int status) {
	fprintf(stderr, "seqdiff - a bioinformatics tool for comparing sequences in two files\n");
	fprintf(stderr, "\n(Written by bct - 2013)     ");
	/*  fprintf(stderr, "search method: %s",PULLSEQ_SORTMETHOD); */
	fprintf(stderr, "\nUsage:\n"
			"%s -1 <first input fasta/fastq file> -2 <second fasta/fastq file>\n\n", progname);
	fprintf(stderr, "  Options:\n"
			"    -1, --first,      First sequence file (required)\n"
			"    -2, --second,     Second sequence file (required)\n");
	fprintf(stderr, "    -a, --a_output,   File name for uniques from first file\n"
			"    -b, --b_output,   File name for uniques from second file\n"
			"    -c, --c_output,   File name for common entries\n");

	fprintf(stderr, "    -d, --headers,    Compare headers instead of sequences (default: false)\n"
			"    -s, --summary, Just show summary stats? (default: false)\n");
	fprintf(stderr, "    -h, --help,       Display this help and exit\n"
			"    -v, --verbose,    Print extra details during the run\n"
			"    --version,        Output version information and exit\n\n");
	exit(status);
}